

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O0

void * Wlc_NtkToNdr(Wlc_Ntk_t *pNtk)

{
  ushort uVar1;
  int ModuleId;
  int iVar2;
  int nInputs;
  int iVar3;
  void *pDesign_00;
  Vec_Int_t *p;
  uint *pBits;
  Wlc_Obj_t *pWVar4;
  int *piVar5;
  Wlc_Obj_t *pFi;
  char *pFunction;
  Vec_Int_t *vFanins;
  int ModId;
  void *pDesign;
  int local_38;
  int Type;
  int iOutId;
  int iFanin;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *pNtk_local;
  
  pObj = (Wlc_Obj_t *)pNtk;
  pDesign_00 = Ndr_Create(1);
  ModuleId = Ndr_AddModule(pDesign_00,1);
  p = Vec_IntAlloc(10);
  for (iFanin = 0; iVar3 = iFanin, iVar2 = Wlc_NtkPiNum((Wlc_Ntk_t *)pObj), iVar3 < iVar2;
      iFanin = iFanin + 1) {
    _k = Wlc_NtkPi((Wlc_Ntk_t *)pObj,iFanin);
    local_38 = Wlc_ObjId((Wlc_Ntk_t *)pObj,_k);
    Ndr_AddObject(pDesign_00,ModuleId,3,0,_k->End,_k->Beg,(uint)(*(ushort *)_k >> 6 & 1),0,
                  (int *)0x0,1,&local_38,(char *)0x0);
  }
  local_38 = 1;
  do {
    iVar3 = local_38;
    iVar2 = Wlc_NtkObjNumMax((Wlc_Ntk_t *)pObj);
    if (iVar2 <= iVar3) {
      for (local_38 = 1; iVar3 = local_38, iVar2 = Wlc_NtkObjNumMax((Wlc_Ntk_t *)pObj),
          iVar3 < iVar2; local_38 = local_38 + 1) {
        _k = Wlc_NtkObj((Wlc_Ntk_t *)pObj,local_38);
        iVar3 = Wlc_ObjIsPo(_k);
        if (iVar3 != 0) {
          Vec_IntFill(p,1,local_38);
          iVar3 = _k->End;
          iVar2 = _k->Beg;
          uVar1 = *(ushort *)_k;
          piVar5 = Vec_IntArray(p);
          Ndr_AddObject(pDesign_00,ModuleId,4,0,iVar3,iVar2,(uint)(uVar1 >> 6 & 1),1,piVar5,0,
                        (int *)0x0,(char *)0x0);
        }
      }
      Vec_IntFree(p);
      return pDesign_00;
    }
    _k = Wlc_NtkObj((Wlc_Ntk_t *)pObj,local_38);
    pFi = (Wlc_Obj_t *)0x0;
    iVar3 = Wlc_ObjIsPi(_k);
    if ((iVar3 == 0) &&
       ((undefined1  [24])((undefined1  [24])*_k & (undefined1  [24])0x3f) != (undefined1  [24])0x0)
       ) {
      Vec_IntClear(p);
      for (iOutId = 0; iVar3 = iOutId, iVar2 = Wlc_ObjFaninNum(_k), iVar3 < iVar2;
          iOutId = iOutId + 1) {
        Type = Wlc_ObjFaninId(_k,iOutId);
        Vec_IntPush(p,Type);
      }
      if ((undefined1  [24])((undefined1  [24])*_k & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x6) {
        pBits = (uint *)Wlc_ObjFanins(_k);
        iVar3 = Wlc_ObjRange(_k);
        pFi = (Wlc_Obj_t *)Ndr_ObjWriteConstant(pBits,iVar3);
      }
      if ((undefined1  [24])((undefined1  [24])*_k & (undefined1  [24])0x3f) ==
          (undefined1  [24])0x8) {
        pWVar4 = Wlc_ObjFanin0((Wlc_Ntk_t *)pObj,_k);
        iVar3 = Wlc_ObjRange(pWVar4);
        if (iVar3 < 2) goto LAB_003f658e;
        pDesign._4_4_ = 0x2b;
      }
      else {
LAB_003f658e:
        if ((undefined1  [24])((undefined1  [24])*_k & (undefined1  [24])0x3f) ==
            (undefined1  [24])0x3) {
          pWVar4 = Wlc_ObjFo2Fi((Wlc_Ntk_t *)pObj,_k);
          iVar3 = Vec_IntSize(p);
          if (iVar3 != 0) {
            __assert_fail("Vec_IntSize(vFanins) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                          ,0xde,"void *Wlc_NtkToNdr(Wlc_Ntk_t *)");
          }
          iVar3 = Wlc_ObjId((Wlc_Ntk_t *)pObj,pWVar4);
          Vec_IntPush(p,iVar3);
          Vec_IntFillExtra(p,7,0);
          pDesign._4_4_ = 0x59;
        }
        else {
          pDesign._4_4_ = Ndr_TypeWlc2Ndr((uint)(*(ushort *)_k & 0x3f));
        }
      }
      if (pDesign._4_4_ < 1) {
        __assert_fail("Type > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNdr.c"
                      ,0xe5,"void *Wlc_NtkToNdr(Wlc_Ntk_t *)");
      }
      iVar3 = _k->End;
      iVar2 = _k->Beg;
      uVar1 = *(ushort *)_k;
      nInputs = Vec_IntSize(p);
      piVar5 = Vec_IntArray(p);
      Ndr_AddObject(pDesign_00,ModuleId,pDesign._4_4_,0,iVar3,iVar2,(uint)(uVar1 >> 6 & 1),nInputs,
                    piVar5,1,&local_38,(char *)pFi);
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void * Wlc_NtkToNdr( Wlc_Ntk_t * pNtk )
{
    Wlc_Obj_t * pObj; 
    int i, k, iFanin, iOutId, Type;
    // create a new module
    void * pDesign = Ndr_Create( 1 );
    int ModId = Ndr_AddModule( pDesign, 1 );
    // add primary inputs
    Vec_Int_t * vFanins = Vec_IntAlloc( 10 );
    Wlc_NtkForEachPi( pNtk, pObj, i ) 
    {
        iOutId = Wlc_ObjId(pNtk, pObj);
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CI, 0,   
            pObj->End, pObj->Beg, pObj->Signed,   
            0, NULL,      1, &iOutId,  NULL  ); // no fanins
    }
    // add internal nodes 
    Wlc_NtkForEachObj( pNtk, pObj, iOutId ) 
    {
        char * pFunction = NULL;
        if ( Wlc_ObjIsPi(pObj) || pObj->Type == 0 )
            continue;
        Vec_IntClear( vFanins );
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Vec_IntPush( vFanins, iFanin );
        if ( pObj->Type == WLC_OBJ_CONST )
            pFunction = Ndr_ObjWriteConstant( (unsigned *)Wlc_ObjFanins(pObj), Wlc_ObjRange(pObj) );
        if ( pObj->Type == WLC_OBJ_MUX && Wlc_ObjRange(Wlc_ObjFanin0(pNtk, pObj)) > 1 )
            Type = ABC_OPER_SEL_NMUX;
        else if ( pObj->Type == WLC_OBJ_FO )
        {
            Wlc_Obj_t * pFi = Wlc_ObjFo2Fi( pNtk, pObj );
            assert( Vec_IntSize(vFanins) == 0 );
            Vec_IntPush( vFanins, Wlc_ObjId(pNtk, pFi) );
            Vec_IntFillExtra( vFanins, 7, 0 );
            Type = ABC_OPER_DFFRSE;
        }
        else
            Type = Ndr_TypeWlc2Ndr(pObj->Type);
        assert( Type > 0 );
        Ndr_AddObject( pDesign, ModId, Type, 0,   
            pObj->End, pObj->Beg, pObj->Signed,   
            Vec_IntSize(vFanins), Vec_IntArray(vFanins), 1, &iOutId,  pFunction  ); 
    }
    // add primary outputs
    Wlc_NtkForEachObj( pNtk, pObj, iOutId ) 
    {
        if ( !Wlc_ObjIsPo(pObj) )
            continue;
        Vec_IntFill( vFanins, 1, iOutId );
        Ndr_AddObject( pDesign, ModId, ABC_OPER_CO, 0,                   
            pObj->End, pObj->Beg, pObj->Signed,   
            1, Vec_IntArray(vFanins),  0, NULL,  NULL ); 
    }
    Vec_IntFree( vFanins );
    return pDesign;
}